

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

void __thiscall
Js::InterpreterStackFrame::
OP_ArgOut_ANonVar<Js::OpLayoutT_Arg<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_Arg<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> *playout)

{
  SetOut(this,playout->Arg,*(Var *)(this + (ulong)playout->Reg * 8 + 0x160));
  return;
}

Assistant:

void InterpreterStackFrame::OP_ArgOut_ANonVar(const unaligned T * playout)
    {
        SetOut(playout->Arg, GetNonVarReg(playout->Reg));
    }